

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-bitmap.h
# Opt level: O0

int bitmap_set_bit_p(bitmap_t bm,size_t nb)

{
  ulong uVar1;
  bitmap_el_t *pbVar2;
  ulong uVar3;
  byte bVar4;
  int res;
  bitmap_el_t *addr;
  size_t sh;
  size_t nw;
  size_t nb_local;
  bitmap_t bm_local;
  
  bitmap_expand(bm,nb + 1);
  pbVar2 = VARR_bitmap_el_taddr(bm);
  uVar3 = nb >> 6;
  bVar4 = (byte)nb & 0x3f;
  uVar1 = pbVar2[uVar3];
  pbVar2[uVar3] = 1L << bVar4 | pbVar2[uVar3];
  return (uint)((uVar1 >> bVar4 & 1) == 0);
}

Assistant:

static inline int bitmap_set_bit_p (bitmap_t bm, size_t nb) {
  size_t nw, sh;
  bitmap_el_t *addr;
  int res;

  bitmap_expand (bm, nb + 1);
  addr = VARR_ADDR (bitmap_el_t, bm);
  nw = nb / BITMAP_WORD_BITS;
  sh = nb % BITMAP_WORD_BITS;
  res = ((addr[nw] >> sh) & 1) == 0;
  addr[nw] |= (bitmap_el_t) 1 << sh;
  return res;
}